

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.h
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::Error<>(Lexer *this,char *format)

{
  if (this->m_error == false) {
    if ((this->m_name)._M_string_length == 0) {
      LogWrite(Error,"Error at line %i, column %i:",(ulong)this->m_lineNumber,
               (ulong)this->m_columnNumber);
    }
    else {
      LogWrite(Error,"Error in \'%s\' at line %i, column %i: ",(this->m_name)._M_dataplus._M_p,
               (ulong)this->m_lineNumber,(ulong)this->m_columnNumber);
    }
    LogWriteLine(Error,format);
    ErrorWriteDetails(this);
    this->m_error = true;
  }
  return;
}

Assistant:

void Error(const char * format, Args&&... args)
		{
			if (m_error)
				return;
			if (m_name.empty())
				LogWrite(LogLevel::Error, "Error at line %i, column %i:", m_lineNumber, m_columnNumber);
			else
				LogWrite(LogLevel::Error, "Error in '%s' at line %i, column %i: ", m_name.c_str(), m_lineNumber, m_columnNumber);
			LogWriteLine(LogLevel::Error, format, std::forward<Args>(args)...);
			ErrorWriteDetails();
			m_error = true;
		}